

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

int CountNbCollisions<Blob<224>>(vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes,int nbHBits)

{
  pointer pBVar1;
  pointer pBVar2;
  bool bVar3;
  int iVar4;
  size_t hnb;
  ulong uVar5;
  long lVar6;
  Blob<224> h2;
  Blob<224> h1;
  
  pBVar1 = (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pBVar2 = (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = 0;
  lVar6 = 0;
  for (uVar5 = 1; uVar5 < (ulong)(((long)pBVar1 - (long)pBVar2) / 0x1c); uVar5 = uVar5 + 1) {
    Blob<224>::operator>>
              (&h1,(Blob<224> *)
                   (((hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
                     super__Vector_impl_data._M_start)->bytes + lVar6),0xe0 - nbHBits);
    Blob<224>::operator>>
              (&h2,(Blob<224> *)
                   ((hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
                    super__Vector_impl_data._M_start[1].bytes + lVar6),0xe0 - nbHBits);
    bVar3 = Blob<224>::operator==(&h1,&h2);
    iVar4 = iVar4 + (uint)bVar3;
    lVar6 = lVar6 + 0x1c;
  }
  return iVar4;
}

Assistant:

int CountNbCollisions ( std::vector<hashtype> & hashes, int nbHBits)
{
  const int origBits = sizeof(hashtype) * 8;
  const int shiftBy = origBits - nbHBits;

  assert(shiftBy > 0);

  size_t const nbH = hashes.size();
  int collcount = 0;

  for (size_t hnb = 1; hnb < nbH; hnb++)
  {
    hashtype const h1 = hashes[hnb-1] >> shiftBy;
    hashtype const h2 = hashes[hnb]   >> shiftBy;
    if(h1 == h2)
    {
      collcount++;
    }
  }

  return collcount;
}